

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

QOpenGLFunctionsPrivateEx * qt_gl_functions(QOpenGLContext *context)

{
  QOpenGLFunctionsPrivateEx *pQVar1;
  long in_RDI;
  QOpenGLFunctionsPrivateEx *funcs;
  QHash<QAbstractFileIconProvider::IconType,_QIcon> *in_stack_00000018;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>_>
  *in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    QOpenGLContext::currentContext();
  }
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>_>::
  operator()(in_stack_ffffffffffffffe8);
  pQVar1 = QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
                     (in_stack_00000018,context);
  return pQVar1;
}

Assistant:

static QOpenGLFunctionsPrivateEx *qt_gl_functions(QOpenGLContext *context = nullptr)
{
    if (!context)
        context = QOpenGLContext::currentContext();
    Q_ASSERT(context);
    QOpenGLFunctionsPrivateEx *funcs =
        qt_gl_functions_resource()->value<QOpenGLFunctionsPrivateEx>(context);
    return funcs;
}